

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  size_type *psVar1;
  char *__s;
  size_type *__s_00;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  string *in_RDI;
  size_type *local_198;
  string s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  char *local_d8;
  string format;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [8];
  FilePath result;
  long local_68;
  undefined1 local_58 [8];
  FilePath output_name;
  
  local_198 = &s._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,FLAGS_gtest_output_abi_cxx11_,
             DAT_00152600 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_198;
  GetOutputFormat_abi_cxx11_();
  if (format._M_dataplus._M_p == (pointer)0x0) {
    psVar1 = &output_name.pathname_._M_string_length;
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"xml","");
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_58);
    if (local_58 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_58,output_name.pathname_._M_string_length + 1);
    }
  }
  pcVar3 = strchr((char *)__s_00,0x3a);
  if (pcVar3 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(s.field_2._M_local_buf + 8),
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)(format.field_2._M_local_buf + 8));
    FilePath::FilePath((FilePath *)local_98,(string *)((long)&s.field_2 + 8));
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"test_detail","");
    FilePath::FilePath((FilePath *)((long)&result.pathname_.field_2 + 8),&local_138);
    FilePath::MakeFileName
              ((FilePath *)local_58,(FilePath *)local_98,
               (FilePath *)((long)&result.pathname_.field_2 + 8),0,local_d8);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if (local_58 != (undefined1  [8])&output_name.pathname_._M_string_length) {
      operator_delete((void *)local_58,output_name.pathname_._M_string_length + 1);
    }
    if ((long *)result.pathname_.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)result.pathname_.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != (undefined1  [8])&result.pathname_._M_string_length) {
      operator_delete((void *)local_98,result.pathname_._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s.field_2._8_8_ == &local_168) goto LAB_00113834;
  }
  else {
    __s = pcVar3 + 1;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,__s,pcVar3 + sVar4 + 1);
    FilePath::FilePath((FilePath *)local_58,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    bVar2 = FilePath::IsAbsolutePath((FilePath *)local_58);
    if (!bVar2) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,
                 (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath((FilePath *)((long)&result.pathname_.field_2 + 8),&local_158);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,__s,__s + sVar4);
      FilePath::FilePath((FilePath *)((long)&format.field_2 + 8),&local_f8);
      FilePath::ConcatPaths
                ((FilePath *)local_98,(FilePath *)((long)&result.pathname_.field_2 + 8),
                 (FilePath *)((long)&format.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_58,(string *)local_98);
      if (local_98 != (undefined1  [8])&result.pathname_._M_string_length) {
        operator_delete((void *)local_98,result.pathname_._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)format.field_2._8_8_ != &local_a8) {
        operator_delete((void *)format.field_2._8_8_,local_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((long *)result.pathname_.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)result.pathname_.field_2._8_8_,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = FilePath::IsDirectory((FilePath *)local_58);
    if (bVar2) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_98,(FilePath *)local_58,
                 (FilePath *)((long)&result.pathname_.field_2 + 8),(char *)format.field_2._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)format.field_2._8_8_ != &local_a8) {
        operator_delete((void *)format.field_2._8_8_,local_a8._M_allocated_capacity + 1);
      }
      if ((long *)result.pathname_.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)result.pathname_.field_2._8_8_,local_68 + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if (local_98 != (undefined1  [8])&result.pathname_._M_string_length) {
        operator_delete((void *)local_98,result.pathname_._M_string_length + 1);
      }
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    local_168._M_allocated_capacity = output_name.pathname_._M_string_length;
    s.field_2._8_8_ = local_58;
    if (local_58 == (undefined1  [8])&output_name.pathname_._M_string_length) goto LAB_00113834;
  }
  operator_delete((void *)s.field_2._8_8_,local_168._M_allocated_capacity + 1);
LAB_00113834:
  if ((size_type *)local_d8 != &format._M_string_length) {
    operator_delete(local_d8,format._M_string_length + 1);
  }
  if (local_198 != &s._M_string_length) {
    operator_delete(local_198,s._M_string_length + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}